

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

Nwk_Grf_t * Nwk_ManLutMergeReadGraph(char *pFileName)

{
  int iVar1;
  Nwk_Grf_t *p_00;
  int local_98;
  int RetValue;
  int iNode2;
  int iNode1;
  int nEdges;
  int nNodes;
  char Buffer [100];
  FILE *pFile;
  Nwk_Grf_t *p;
  char *pFileName_local;
  
  register0x00000000 = fopen(pFileName,"r");
  __isoc99_fscanf(register0x00000000,"%s %d",&nEdges,&iNode1);
  __isoc99_fscanf(stack0xffffffffffffffe0,"%s %d",&nEdges,&iNode2);
  p_00 = Nwk_ManGraphAlloc(iNode1);
  while( true ) {
    iVar1 = __isoc99_fscanf(stack0xffffffffffffffe0,"%s %d %d",&nEdges,&RetValue,&local_98);
    if (iVar1 != 3) break;
    Nwk_ManGraphHashEdge(p_00,RetValue,local_98);
  }
  if (p_00->nEdges == iNode2) {
    fclose(stack0xffffffffffffffe0);
    return p_00;
  }
  __assert_fail("p->nEdges == nEdges",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/nwk/nwkMerge.c"
                ,0x2af,"Nwk_Grf_t *Nwk_ManLutMergeReadGraph(char *)");
}

Assistant:

Nwk_Grf_t * Nwk_ManLutMergeReadGraph( char * pFileName )
{
    Nwk_Grf_t * p;
    FILE * pFile;
    char Buffer[100];
    int nNodes, nEdges, iNode1, iNode2;
    int RetValue;
    pFile = fopen( pFileName, "r" );
    RetValue = fscanf( pFile, "%s %d", Buffer, &nNodes );
    RetValue = fscanf( pFile, "%s %d", Buffer, &nEdges );
    p = Nwk_ManGraphAlloc( nNodes );
    while ( fscanf( pFile, "%s %d %d", Buffer, &iNode1, &iNode2 ) == 3 )
        Nwk_ManGraphHashEdge( p, iNode1, iNode2 );
    assert( p->nEdges == nEdges );
    fclose( pFile );
    return p;
}